

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_dist.h
# Opt level: O1

double manifold::DistanceTriangleTriangleSquared
                 (array<linalg::vec<double,_3>,_3UL> *p,array<linalg::vec<double,_3>,_3UL> *q)

{
  vec<double,_3> *pvVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  vec3 *q_00;
  vec3 *a;
  bool bVar8;
  vec3 *b;
  bool bVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  vec3 cp;
  array<linalg::vec<double,_3>,_3UL> Sv;
  vec3 cq;
  array<linalg::vec<double,_3>,_3UL> Tv;
  vec3 local_138;
  ulong local_118;
  vec3 *local_110;
  double local_108;
  vec3 *local_100;
  vec3 local_f8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  vec3 local_98;
  array<linalg::vec<double,_3>,_3UL> *local_80;
  vec3 local_78;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  dVar11 = p->_M_elems[1].x;
  local_c8 = p->_M_elems[0].x;
  dStack_c0 = p->_M_elems[0].y;
  local_f8.x = dVar11 - local_c8;
  dVar14 = p->_M_elems[1].y;
  local_f8.y = dVar14 - dStack_c0;
  dVar12 = p->_M_elems[1].z;
  local_b8 = p->_M_elems[0].z;
  local_f8.z = dVar12 - local_b8;
  dStack_e0 = p->_M_elems[2].x;
  local_d8 = p->_M_elems[2].y;
  local_c8 = local_c8 - dStack_e0;
  dStack_e0 = dStack_e0 - dVar11;
  dStack_c0 = dStack_c0 - local_d8;
  local_d8 = local_d8 - dVar14;
  dStack_d0 = p->_M_elems[2].z;
  local_b8 = local_b8 - dStack_d0;
  dStack_d0 = dStack_d0 - dVar12;
  dVar11 = q->_M_elems[1].x;
  local_48 = q->_M_elems[0].x;
  dStack_40 = q->_M_elems[0].y;
  local_78.x = dVar11 - local_48;
  dVar14 = q->_M_elems[1].y;
  local_78.y = dVar14 - dStack_40;
  dVar12 = q->_M_elems[1].z;
  local_38 = q->_M_elems[0].z;
  local_78.z = dVar12 - local_38;
  dStack_60 = q->_M_elems[2].x;
  local_58 = q->_M_elems[2].y;
  local_48 = local_48 - dStack_60;
  dStack_60 = dStack_60 - dVar11;
  dStack_40 = dStack_40 - local_58;
  local_58 = local_58 - dVar14;
  dStack_50 = q->_M_elems[2].z;
  local_38 = local_38 - dStack_50;
  dStack_50 = dStack_50 - dVar12;
  dVar11 = 1.79769313486232e+308;
  local_118 = 0;
  bVar10 = false;
  bVar8 = false;
  local_100 = q->_M_elems;
  local_80 = p;
  do {
    local_110 = local_80->_M_elems + local_118;
    uVar6 = (ulong)((int)local_118 - 1);
    if (local_118 == 0) {
      uVar6 = 2;
    }
    a = &local_f8 + local_118;
    pvVar1 = local_80->_M_elems + uVar6;
    uVar6 = 0;
    b = &local_78;
    bVar9 = false;
    q_00 = local_100;
    do {
      local_138.x = 0.0;
      local_138.y = 0.0;
      local_138.z = 0.0;
      local_98.z = 0.0;
      local_98.x = 0.0;
      local_98.y = 0.0;
      EdgeEdgeDist(&local_138,&local_98,local_110,a,q_00,b);
      dVar16 = local_98.x - local_138.x;
      dVar17 = local_98.y - local_138.y;
      dVar19 = local_98.z - local_138.z;
      dVar12 = dVar19 * dVar19 + dVar17 * dVar17 + dVar16 * dVar16;
      bVar3 = true;
      dVar14 = local_108;
      if (dVar12 <= dVar11) {
        dVar13 = (pvVar1->x - local_138.x) * dVar16 + 0.0 + (pvVar1->y - local_138.y) * dVar17 +
                 (pvVar1->z - local_138.z) * dVar19;
        uVar5 = (ulong)((int)uVar6 - 1);
        if (uVar6 == 0) {
          uVar5 = 2;
        }
        dVar16 = (local_100[uVar5].x - local_98.x) * dVar16 + 0.0 +
                 (local_100[uVar5].y - local_98.y) * dVar17 +
                 (local_100[uVar5].z - local_98.z) * dVar19;
        bVar3 = 0.0 < dVar13 || dVar16 < 0.0;
        dVar11 = dVar12;
        dVar14 = dVar12;
        if (0.0 < dVar13 || dVar16 < 0.0) {
          if (dVar13 <= 0.0) {
            dVar13 = 0.0;
          }
          else if (0.0 < dVar16) {
            dVar16 = 0.0;
          }
          dVar14 = local_108;
          if (0.0 < (dVar12 - dVar13) + dVar16) {
            bVar8 = true;
          }
        }
      }
      local_108 = dVar14;
      if (!bVar3) break;
      bVar9 = 1 < uVar6;
      uVar6 = uVar6 + 1;
      q_00 = q_00 + 1;
      b = b + 1;
    } while (uVar6 != 3);
    if (!bVar9) break;
    bVar10 = 1 < local_118;
    local_118 = local_118 + 1;
  } while (local_118 != 3);
  if (!bVar10) {
    return local_108;
  }
  dVar14 = local_f8.y * dStack_d0 - local_d8 * local_f8.z;
  dVar17 = local_f8.z * dStack_e0 - dStack_d0 * local_f8.x;
  dVar12 = local_f8.x * local_d8 - dStack_e0 * local_f8.y;
  dVar16 = dVar12 * dVar12 + dVar17 * dVar17 + dVar14 * dVar14;
  if (1e-15 < dVar16) {
    dVar19 = local_80->_M_elems[0].x;
    dVar13 = local_80->_M_elems[0].y;
    dVar2 = local_80->_M_elems[0].z;
    local_138.x = (dVar19 - local_100->x) * dVar14 + 0.0 + (dVar13 - local_100->y) * dVar17 +
                  (dVar2 - local_100->z) * dVar12;
    local_138.y = (dVar19 - local_100[1].x) * dVar14 + 0.0 + (dVar13 - local_100[1].y) * dVar17 +
                  (dVar2 - local_100[1].z) * dVar12;
    local_138.z = (dVar19 - local_100[2].x) * dVar14 + 0.0 + (dVar13 - local_100[2].y) * dVar17 +
                  (dVar2 - local_100[2].z) * dVar12;
    if (((local_138.x <= 0.0) || (local_138.y <= 0.0)) || (local_138.z <= 0.0)) {
      uVar6 = 0xffffffff;
      if (((local_138.x < 0.0) && (local_138.y < 0.0)) &&
         ((local_138.z < 0.0 &&
          (uVar6 = (ulong)(local_138.x <= local_138.y),
          (&local_138.x)[uVar6] <= local_138.z && local_138.z != (&local_138.x)[uVar6]))))
      goto LAB_0016c243;
    }
    else {
      uVar6 = (ulong)(local_138.y <= local_138.x);
      if (local_138.z < (&local_138.x)[uVar6]) {
LAB_0016c243:
        uVar6 = 2;
      }
    }
    iVar4 = (int)uVar6;
    if (iVar4 < 0) {
LAB_0016c4e7:
      bVar10 = true;
    }
    else {
      dVar15 = local_100[uVar6].x;
      dVar20 = local_100[uVar6].y;
      dVar18 = local_100[uVar6].z;
      if (0.0 < (dVar17 * local_f8.z - local_f8.y * dVar12) * (dVar15 - dVar19) + 0.0 +
                (dVar12 * local_f8.x - local_f8.z * dVar14) * (dVar20 - dVar13) +
                (dVar14 * local_f8.y - local_f8.x * dVar17) * (dVar18 - dVar2)) {
        if (0.0 < (dVar17 * dStack_d0 + local_d8 * -dVar12) * (dVar15 - local_80->_M_elems[1].x) +
                  0.0 + (dVar12 * dStack_e0 + dStack_d0 * -dVar14) *
                        (dVar20 - local_80->_M_elems[1].y) +
                  (dStack_e0 * -dVar17 + dVar14 * local_d8) * (dVar18 - local_80->_M_elems[1].z)) {
          bVar8 = true;
          if ((dVar17 * local_b8 + -dVar12 * dStack_c0) * (dVar15 - local_80->_M_elems[2].x) + 0.0 +
              (dVar12 * local_c8 + -dVar14 * local_b8) * (dVar20 - local_80->_M_elems[2].y) +
              (dStack_c0 * dVar14 + -dVar17 * local_c8) * (dVar18 - local_80->_M_elems[2].z) <= 0.0)
          goto LAB_0016c4e7;
          bVar10 = false;
          lVar7 = 0;
          if (iVar4 != 0) {
            lVar7 = (ulong)(iVar4 != 1) * 8 + 8;
          }
          dVar19 = *(double *)((long)&local_138.x + lVar7);
          dVar15 = ((dVar14 * dVar19) / dVar16 + dVar15) - dVar15;
          dVar20 = ((dVar17 * dVar19) / dVar16 + dVar20) - dVar20;
          dVar18 = ((dVar12 * dVar19) / dVar16 + dVar18) - dVar18;
          local_108 = dVar18 * dVar18 + dVar20 * dVar20 + dVar15 * dVar15;
          goto LAB_0016c4e9;
        }
      }
      bVar10 = true;
      bVar8 = true;
    }
LAB_0016c4e9:
    if (!bVar10) {
      return local_108;
    }
  }
  dVar14 = local_78.y * dStack_50 - local_58 * local_78.z;
  dVar17 = local_78.z * dStack_60 - dStack_50 * local_78.x;
  dVar12 = local_78.x * local_58 - dStack_60 * local_78.y;
  dVar16 = dVar12 * dVar12 + dVar17 * dVar17 + dVar14 * dVar14;
  if (dVar16 <= 1e-15) goto LAB_0016c9ba;
  dVar19 = local_100->x;
  dVar13 = local_100->y;
  dVar2 = local_100->z;
  local_138.x = (dVar19 - local_80->_M_elems[0].x) * dVar14 + 0.0 +
                (dVar13 - local_80->_M_elems[0].y) * dVar17 +
                (dVar2 - local_80->_M_elems[0].z) * dVar12;
  local_138.y = (dVar19 - local_80->_M_elems[1].x) * dVar14 + 0.0 +
                (dVar13 - local_80->_M_elems[1].y) * dVar17 +
                (dVar2 - local_80->_M_elems[1].z) * dVar12;
  local_138.z = (dVar19 - local_80->_M_elems[2].x) * dVar14 + 0.0 +
                (dVar13 - local_80->_M_elems[2].y) * dVar17 +
                (dVar2 - local_80->_M_elems[2].z) * dVar12;
  if (((local_138.x <= 0.0) || (local_138.y <= 0.0)) || (local_138.z <= 0.0)) {
    uVar6 = 0xffffffff;
    if ((((local_138.x < 0.0) && (local_138.y < 0.0)) && (local_138.z < 0.0)) &&
       (uVar6 = (ulong)(local_138.x <= local_138.y),
       (&local_138.x)[uVar6] <= local_138.z && local_138.z != (&local_138.x)[uVar6]))
    goto LAB_0016c710;
  }
  else {
    uVar6 = (ulong)(local_138.y <= local_138.x);
    if (local_138.z < (&local_138.x)[uVar6]) {
LAB_0016c710:
      uVar6 = 2;
    }
  }
  iVar4 = (int)uVar6;
  if (iVar4 < 0) {
LAB_0016c9b4:
    bVar10 = true;
  }
  else {
    dVar15 = local_80->_M_elems[uVar6].x;
    dVar20 = local_80->_M_elems[uVar6].y;
    dVar18 = local_80->_M_elems[uVar6].z;
    if (0.0 < (dVar17 * local_78.z - local_78.y * dVar12) * (dVar15 - dVar19) + 0.0 +
              (dVar12 * local_78.x - local_78.z * dVar14) * (dVar20 - dVar13) +
              (dVar14 * local_78.y - local_78.x * dVar17) * (dVar18 - dVar2)) {
      if (0.0 < (dVar17 * dStack_50 + local_58 * -dVar12) * (dVar15 - local_100[1].x) + 0.0 +
                (dVar12 * dStack_60 + dStack_50 * -dVar14) * (dVar20 - local_100[1].y) +
                (dStack_60 * -dVar17 + dVar14 * local_58) * (dVar18 - local_100[1].z)) {
        bVar8 = true;
        if ((dVar17 * local_38 + -dVar12 * dStack_40) * (dVar15 - local_100[2].x) + 0.0 +
            (dVar12 * local_48 + -dVar14 * local_38) * (dVar20 - local_100[2].y) +
            (dStack_40 * dVar14 + -dVar17 * local_48) * (dVar18 - local_100[2].z) <= 0.0)
        goto LAB_0016c9b4;
        bVar10 = false;
        lVar7 = 0;
        if (iVar4 != 0) {
          lVar7 = (ulong)(iVar4 != 1) * 8 + 8;
        }
        dVar19 = *(double *)((long)&local_138.x + lVar7);
        dVar15 = dVar15 - ((dVar14 * dVar19) / dVar16 + dVar15);
        dVar20 = dVar20 - ((dVar17 * dVar19) / dVar16 + dVar20);
        dVar18 = dVar18 - ((dVar12 * dVar19) / dVar16 + dVar18);
        local_108 = dVar18 * dVar18 + dVar20 * dVar20 + dVar15 * dVar15;
        goto LAB_0016c9b6;
      }
    }
    bVar10 = true;
    bVar8 = true;
  }
LAB_0016c9b6:
  if (!bVar10) {
    return local_108;
  }
LAB_0016c9ba:
  local_108 = dVar11;
  if (!bVar8) {
    local_108 = 0.0;
  }
  return local_108;
}

Assistant:

inline auto DistanceTriangleTriangleSquared(const std::array<vec3, 3>& p,
                                            const std::array<vec3, 3>& q) {
  std::array<vec3, 3> Sv;
  Sv[0] = p[1] - p[0];
  Sv[1] = p[2] - p[1];
  Sv[2] = p[0] - p[2];

  std::array<vec3, 3> Tv;
  Tv[0] = q[1] - q[0];
  Tv[1] = q[2] - q[1];
  Tv[2] = q[0] - q[2];

  bool shown_disjoint = false;

  auto mindd = std::numeric_limits<double>::max();

  for (uint32_t i = 0; i < 3; i++) {
    for (uint32_t j = 0; j < 3; j++) {
      vec3 cp;
      vec3 cq;
      EdgeEdgeDist(cp, cq, p[i], Sv[i], q[j], Tv[j]);
      const vec3 V = cq - cp;
      const auto dd = la::dot(V, V);

      if (dd <= mindd) {
        mindd = dd;

        uint32_t id = i + 2;
        if (id >= 3) id -= 3;
        vec3 Z = p[id] - cp;
        auto a = la::dot(Z, V);
        id = j + 2;
        if (id >= 3) id -= 3;
        Z = q[id] - cq;
        auto b = la::dot(Z, V);

        if ((a <= 0.0) && (b >= 0.0)) {
          return la::dot(V, V);
        };

        if (a <= 0.0)
          a = 0.0;
        else if (b > 0.0)
          b = 0.0;

        if ((mindd - a + b) > 0.0) shown_disjoint = true;
      }
    }
  }

  vec3 Sn = la::cross(Sv[0], Sv[1]);
  auto Snl = la::dot(Sn, Sn);

  if (Snl > 1e-15) {
    const vec3 Tp(la::dot(p[0] - q[0], Sn), la::dot(p[0] - q[1], Sn),
                  la::dot(p[0] - q[2], Sn));

    int index = -1;
    if ((Tp[0] > 0.0) && (Tp[1] > 0.0) && (Tp[2] > 0.0)) {
      index = Tp[0] < Tp[1] ? 0 : 1;
      if (Tp[2] < Tp[index]) index = 2;
    } else if ((Tp[0] < 0.0) && (Tp[1] < 0.0) && (Tp[2] < 0.0)) {
      index = Tp[0] > Tp[1] ? 0 : 1;
      if (Tp[2] > Tp[index]) index = 2;
    }

    if (index >= 0) {
      shown_disjoint = true;

      const vec3& qIndex = q[index];

      vec3 V = qIndex - p[0];
      vec3 Z = la::cross(Sn, Sv[0]);
      if (la::dot(V, Z) > 0.0) {
        V = qIndex - p[1];
        Z = la::cross(Sn, Sv[1]);
        if (la::dot(V, Z) > 0.0) {
          V = qIndex - p[2];
          Z = la::cross(Sn, Sv[2]);
          if (la::dot(V, Z) > 0.0) {
            vec3 cp = qIndex + Sn * Tp[index] / Snl;
            vec3 cq = qIndex;
            return la::dot(cp - cq, cp - cq);
          }
        }
      }
    }
  }

  vec3 Tn = la::cross(Tv[0], Tv[1]);
  auto Tnl = la::dot(Tn, Tn);

  if (Tnl > 1e-15) {
    const vec3 Sp(la::dot(q[0] - p[0], Tn), la::dot(q[0] - p[1], Tn),
                  la::dot(q[0] - p[2], Tn));

    int index = -1;
    if ((Sp[0] > 0.0) && (Sp[1] > 0.0) && (Sp[2] > 0.0)) {
      index = Sp[0] < Sp[1] ? 0 : 1;
      if (Sp[2] < Sp[index]) index = 2;
    } else if ((Sp[0] < 0.0) && (Sp[1] < 0.0) && (Sp[2] < 0.0)) {
      index = Sp[0] > Sp[1] ? 0 : 1;
      if (Sp[2] > Sp[index]) index = 2;
    }

    if (index >= 0) {
      shown_disjoint = true;

      const vec3& pIndex = p[index];

      vec3 V = pIndex - q[0];
      vec3 Z = la::cross(Tn, Tv[0]);
      if (la::dot(V, Z) > 0.0) {
        V = pIndex - q[1];
        Z = la::cross(Tn, Tv[1]);
        if (la::dot(V, Z) > 0.0) {
          V = pIndex - q[2];
          Z = la::cross(Tn, Tv[2]);
          if (la::dot(V, Z) > 0.0) {
            vec3 cp = pIndex;
            vec3 cq = pIndex + Tn * Sp[index] / Tnl;
            return la::dot(cp - cq, cp - cq);
          }
        }
      }
    }
  }

  return shown_disjoint ? mindd : 0.0;
}